

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_filewrite(char *filename,void *data,size_t length)

{
  FILE *__s;
  size_t sVar1;
  size_t __n;
  
  __s = (FILE *)stb_fopen(filename,"wb");
  if (__s != (FILE *)0x0) {
    if (length != 0) {
      do {
        __n = 0x10000;
        if (length < 0x10000) {
          __n = length;
        }
        sVar1 = fwrite(data,1,__n,__s);
        if (__n != sVar1) {
          fprintf(_stderr,"Failed while writing %s\n",filename);
          break;
        }
        data = (void *)((long)data + __n);
        length = length - __n;
      } while (length != 0);
    }
    stb_fclose((FILE *)__s,2);
  }
  return (int)(__s != (FILE *)0x0);
}

Assistant:

int stb_filewrite(char *filename, void *data, size_t length)
{
   FILE *f = stb_fopen(filename, "wb");
   if (f) {
      unsigned char *data_ptr = (unsigned char *) data;
      size_t remaining = length;
      while (remaining > 0) {
         size_t len2 = remaining > 65536 ? 65536 : remaining;
         size_t len3 = fwrite(data_ptr, 1, len2, f);
         if (len2 != len3) {
            fprintf(stderr, "Failed while writing %s\n", filename);
            break;
         }
         remaining -= len2;
         data_ptr += len2;
      }
      stb_fclose(f, stb_keep_if_different);
   }
   return f != NULL;
}